

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::TSPI_PDU::SetMeasuredSpeedFlag(TSPI_PDU *this,KBOOL F)

{
  KBOOL F_local;
  TSPI_PDU *this_local;
  
  if (F != (KBOOL)((this->m_TSPIFlagUnion).m_ui8Flag >> 5 & 1)) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xdf | F << 5;
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 2;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 2;
    }
  }
  return;
}

Assistant:

void TSPI_PDU::SetMeasuredSpeedFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8Spd )return;

    m_TSPIFlagUnion.m_ui8Spd = F;

    if( F )
    {
        m_ui16PDULength += 2; // 2 = size of KFIXED16.
    }
    else
    {
        m_ui16PDULength -= 2;
    }
}